

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::value(Parser *this)

{
  uint uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 uVar3;
  undefined8 uVar4;
  unsigned_long uVar5;
  bool bVar6;
  _Sp_cp_type *__mem;
  undefined8 *puVar7;
  uint *puVar8;
  undefined8 extraout_RAX;
  pointer pcVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined **ppuVar10;
  Parser *in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ptr<ObjectExpression> pVar14;
  ptr<ArrayExpression> pVar15;
  ptr<Expression> pVar16;
  initializer_list<TokenType> __l;
  allocator_type local_99;
  _Alloc_hider local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [8];
  undefined1 auStack_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  unsigned_long local_60;
  _Alloc_hider _Stack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  unsigned_long local_38;
  
  local_98._M_p = (pointer)0x3c0000003b;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            ((vector<TokenType,_std::allocator<TokenType>_> *)local_88,__l,&local_99);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_80._0_8_;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_88._4_4_,local_88._0_4_);
  if (paVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_80._0_8_) {
    bVar6 = false;
  }
  else {
    do {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar13 + 4);
      bVar6 = match(in_RSI,*(TokenType *)paVar13);
      paVar13 = paVar12;
    } while (paVar12 != paVar11 && !bVar6);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_88._4_4_,local_88._0_4_);
  }
  if (paVar13 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(paVar13,auStack_80._8_8_ - (long)paVar13);
  }
  if (bVar6 != false) {
    local_88._0_4_ = (in_RSI->currentToken).type;
    pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
    auStack_80._0_8_ = &local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_80,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
    uVar3 = local_88._0_4_;
    local_60 = (in_RSI->currentToken).line;
    _Stack_58._M_p = (pointer)(in_RSI->currentToken).col;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_80._0_8_ != &local_70) {
      operator_delete((void *)auStack_80._0_8_,local_70._M_allocated_capacity + 1);
    }
    consume(in_RSI);
    puVar7 = (undefined8 *)operator_new(0x28);
    puVar7[1] = 0x100000001;
    *puVar7 = &PTR___Sp_counted_ptr_inplace_001304c0;
    puVar7[2] = &PTR_evaluate_00130510;
    puVar7[3] = &PTR__Member_0012f670;
    *(bool *)(puVar7 + 4) = uVar3 == True;
    pcVar9 = (pointer)(puVar7 + 2);
    ppuVar10 = (undefined **)extraout_RDX;
LAB_00110553:
    (this->filepath)._M_dataplus._M_p = pcVar9;
    (this->filepath)._M_string_length = (size_type)puVar7;
LAB_0011055a:
    pVar16.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar10;
    pVar16.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Expression>)pVar16.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
  }
  bVar6 = match(in_RSI,Number);
  if (!bVar6) {
LAB_00110265:
    bVar6 = match(in_RSI,SingleQuote);
    if (bVar6) {
      consume(in_RSI);
      local_88._0_4_ = (in_RSI->currentToken).type;
      pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
      auStack_80._0_8_ = &local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_80,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length
                );
      local_60 = (in_RSI->currentToken).line;
      _Stack_58._M_p = (pointer)(in_RSI->currentToken).col;
      local_98._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<PrimitiveExpression<String>,std::allocator<PrimitiveExpression<String>>,std::__cxx11::string&>
                (&local_90,(PrimitiveExpression<String> **)&local_98,
                 (allocator<PrimitiveExpression<String>_> *)&local_99,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_80);
      _Var2._M_pi = local_90._M_pi;
      (this->filepath)._M_dataplus._M_p = local_98._M_p;
      local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
      local_98._M_p = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_80._0_8_ != &local_70) {
        operator_delete((void *)auStack_80._0_8_,local_70._M_allocated_capacity + 1);
      }
      consume(in_RSI,String,"string");
      consume(in_RSI,SingleQuote,"\"\'\"");
      ppuVar10 = (undefined **)extraout_RDX_00;
    }
    else {
      bVar6 = match(in_RSI,DoubleQuote);
      if (bVar6) {
        consume(in_RSI);
        local_88._0_4_ = (in_RSI->currentToken).type;
        pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
        auStack_80._0_8_ = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_80,pcVar9,
                   pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
        local_60 = (in_RSI->currentToken).line;
        _Stack_58._M_p = (pointer)(in_RSI->currentToken).col;
        local_98._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<PrimitiveExpression<String>,std::allocator<PrimitiveExpression<String>>,std::__cxx11::string&>
                  (&local_90,(PrimitiveExpression<String> **)&local_98,
                   (allocator<PrimitiveExpression<String>_> *)&local_99,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_80);
        _Var2._M_pi = local_90._M_pi;
        (this->filepath)._M_dataplus._M_p = local_98._M_p;
        local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
        local_98._M_p = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_80._0_8_ != &local_70) {
          operator_delete((void *)auStack_80._0_8_,local_70._M_allocated_capacity + 1);
        }
        consume(in_RSI,String,"string");
        consume(in_RSI,DoubleQuote,"\'\"\'");
        ppuVar10 = (undefined **)extraout_RDX_01;
        goto LAB_0011055a;
      }
      bVar6 = match(in_RSI,LeftCurly);
      if (bVar6) {
        pVar14 = object((Parser *)local_88);
        ppuVar10 = (undefined **)
                   pVar14.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      }
      else {
        bVar6 = match(in_RSI,LeftBrack);
        if (!bVar6) {
          bVar6 = match(in_RSI,Lambda);
          if (bVar6) {
            pVar16 = lambda(this);
            ppuVar10 = (undefined **)
                       pVar16.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
            goto LAB_0011055a;
          }
          goto LAB_001105ee;
        }
        pVar15 = array((Parser *)local_88);
        ppuVar10 = (undefined **)
                   pVar15.super___shared_ptr<ArrayExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      }
      (this->filepath)._M_dataplus._M_p = (pointer)CONCAT44(local_88._4_4_,local_88._0_4_);
      (this->filepath)._M_string_length = auStack_80._0_8_;
    }
    goto LAB_0011055a;
  }
  local_88._0_4_ = (in_RSI->currentToken).type;
  auStack_80._0_8_ = &local_70;
  pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_80,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
  uVar4 = auStack_80._0_8_;
  local_60 = (in_RSI->currentToken).line;
  _Stack_58._M_p = (pointer)(in_RSI->currentToken).col;
  puVar8 = (uint *)__errno_location();
  uVar1 = *puVar8;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)uVar1;
  *puVar8 = 0;
  local_38 = strtoll((char *)uVar4,&local_98._M_p,10);
  if (local_98._M_p == (pointer)uVar4) {
    std::__throw_invalid_argument("stoll");
  }
  else {
    if (*puVar8 == 0) {
      *puVar8 = uVar1;
    }
    else if (*puVar8 == 0x22) {
      std::__throw_out_of_range("stoll");
      goto LAB_00110265;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_80._0_8_ != &local_70) {
      operator_delete((void *)auStack_80._0_8_,local_70._M_allocated_capacity + 1);
    }
    local_88._0_4_ = (in_RSI->currentToken).type;
    auStack_80._0_8_ = &local_70;
    pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_80,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
    uVar4 = auStack_80._0_8_;
    local_60 = (in_RSI->currentToken).line;
    _Stack_58._M_p = (pointer)(in_RSI->currentToken).col;
    uVar1 = *puVar8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)uVar1;
    *puVar8 = 0;
    local_48._8_8_ = strtod((char *)auStack_80._0_8_,&local_98._M_p);
    if (local_98._M_p != (pointer)uVar4) {
      if (*puVar8 == 0) {
LAB_0011049c:
        *puVar8 = uVar1;
      }
      else if (*puVar8 == 0x22) {
        local_48._8_8_ = std::__throw_out_of_range("stod");
        goto LAB_0011049c;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_80._0_8_ != &local_70) {
        operator_delete((void *)auStack_80._0_8_,local_70._M_allocated_capacity + 1);
      }
      consume(in_RSI);
      uVar5 = local_38;
      local_48._M_allocated_capacity = (size_type)(double)(long)local_38;
      puVar7 = (undefined8 *)operator_new(0x28);
      pcVar9 = (pointer)(puVar7 + 2);
      puVar7[1] = 0x100000001;
      if (((double)local_48._8_8_ != (double)local_48._M_allocated_capacity) ||
         (NAN((double)local_48._8_8_) || NAN((double)local_48._M_allocated_capacity))) {
        *puVar7 = &PTR___Sp_counted_ptr_inplace_001305e0;
        puVar7[2] = &PTR_evaluate_00130630;
        ppuVar10 = &PTR__Member_0012f4f0;
        puVar7[3] = &PTR__Member_0012f4f0;
        puVar7[4] = local_48._8_8_;
      }
      else {
        *puVar7 = &PTR___Sp_counted_ptr_inplace_00130550;
        puVar7[2] = &PTR_evaluate_001305a0;
        ppuVar10 = &PTR__Member_0012f5b0;
        puVar7[3] = &PTR__Member_0012f5b0;
        puVar7[4] = uVar5;
      }
      goto LAB_00110553;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_001105ee:
  unexpected(in_RSI);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_80._0_8_ != paVar11) {
    operator_delete((void *)auStack_80._0_8_,local_70._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ptr<Expression> Parser::value() {
    if(matchAny({ TokenType::True, TokenType::False })) {
        bool logicalValue = token().type == TokenType::True;
        consume();
        return make<PrimitiveExpression<Boolean>>(logicalValue);

    } else if(match(TokenType::Number)) {
        long long int integerValue = std::stoll(token().lexeme);
        double doubleValue = std::stod(token().lexeme);
        consume();

        if(integerValue == doubleValue) {
            return make<PrimitiveExpression<Integer>>(integerValue);
        }

        return make<PrimitiveExpression<Double>>(doubleValue);

    } else if(match(TokenType::SingleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::SingleQuote, "\"'\"");
        return expr;

    } else if(match(TokenType::DoubleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::DoubleQuote, "'\"'");
        return expr;

    } else if(match(TokenType::LeftCurly)) {
        return object();
    } else if(match(TokenType::LeftBrack)) {
        return array();
    } else if(match(TokenType::Lambda)) {
        return lambda();
    } else {
        unexpected();
    }
}